

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

oonf_rfc5444_interface *
oonf_rfc5444_add_interface
          (oonf_rfc5444_protocol *protocol,oonf_rfc5444_interface_listener *listener,char *name)

{
  list_entity *plVar1;
  int iVar2;
  list_entity *plVar3;
  oonf_rfc5444_interface *local_c8;
  undefined2 local_ba;
  oonf_rfc5444_interface *poStack_b8;
  uint16_t rnd;
  oonf_rfc5444_interface *interf;
  char *name_local;
  oonf_rfc5444_interface_listener *listener_local;
  oonf_rfc5444_protocol *protocol_local;
  undefined4 local_90;
  oonf_log_source local_8c;
  uint8_t *local_88;
  undefined4 local_80;
  oonf_log_source local_7c;
  uint8_t *local_78;
  char *local_70;
  oonf_rfc5444_protocol *local_68;
  undefined8 local_60;
  avl_node *local_58;
  undefined8 local_50;
  undefined2 *local_48;
  list_entity *local_40;
  
  interf = (oonf_rfc5444_interface *)name;
  name_local = (char *)listener;
  listener_local = (oonf_rfc5444_interface_listener *)protocol;
  local_70 = name;
  local_68 = protocol;
  local_58 = avl_find(&protocol->_interface_tree,name);
  local_60 = 0x18;
  if (local_58 == (avl_node *)0x0) {
    local_c8 = (oonf_rfc5444_interface *)0x0;
  }
  else {
    local_c8 = (oonf_rfc5444_interface *)&local_58[-1].right;
  }
  poStack_b8 = local_c8;
  if (local_c8 == (oonf_rfc5444_interface *)0x0) {
    local_48 = &local_ba;
    local_50 = 2;
    iVar2 = os_core_linux_get_random(local_48,2);
    if (iVar2 != 0) {
      local_78 = log_global_mask;
      local_7c = _oonf_rfc5444_subsystem.logging;
      local_80 = 4;
      if ((log_global_mask[_oonf_rfc5444_subsystem.logging] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x237,
                 (void *)0x0,0,"Could not get random data");
      }
      return (oonf_rfc5444_interface *)0x0;
    }
    poStack_b8 = (oonf_rfc5444_interface *)oonf_class_malloc(&_interface_memcookie);
    if (poStack_b8 == (oonf_rfc5444_interface *)0x0) {
      return (oonf_rfc5444_interface *)0x0;
    }
    strscpy((char *)poStack_b8,interf->name,0x10);
    *(oonf_rfc5444_interface_listener **)((long)poStack_b8->name + 0x10) = listener_local;
    (poStack_b8->_node).key = poStack_b8;
    avl_insert((avl_tree *)&listener_local[0x15]._node.prev,
               (avl_node *)((long)poStack_b8->name + 0x18));
    avl_init(&poStack_b8->_target_tree,avl_comp_netaddr,false);
    memcpy(&(poStack_b8->_socket).config,&_socket_config,0x28);
    (poStack_b8->_socket).config.user = poStack_b8;
    (poStack_b8->_socket).cb_settings_change = _cb_interface_changed;
    (poStack_b8->_socket).config.dont_route = true;
    oonf_packet_add_managed(&poStack_b8->_socket);
    *(undefined2 *)&listener_local[0x17].interface = local_ba;
    local_40 = &poStack_b8->_listener;
    (poStack_b8->_listener).prev = local_40;
    local_40->next = local_40;
    *(int *)&listener_local[0x17].cb_interface_changed =
         *(int *)&listener_local[0x17].cb_interface_changed + 1;
  }
  local_88 = log_global_mask;
  local_8c = _oonf_rfc5444_subsystem.logging;
  local_90 = 2;
  if ((log_global_mask[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x262,
             (void *)0x0,0,"Add interface %s to protocol %s (refcount was %d)",interf,listener_local
             ,poStack_b8->_refcount);
  }
  poStack_b8->_refcount = poStack_b8->_refcount + 1;
  if (name_local != (char *)0x0) {
    plVar3 = (list_entity *)(name_local + 0x10);
    plVar1 = (poStack_b8->_listener).prev;
    plVar3->next = &poStack_b8->_listener;
    *(list_entity **)(name_local + 0x18) = plVar1;
    (poStack_b8->_listener).prev = plVar3;
    plVar1->next = plVar3;
    *(oonf_rfc5444_interface **)(name_local + 8) = poStack_b8;
  }
  return poStack_b8;
}

Assistant:

struct oonf_rfc5444_interface *
oonf_rfc5444_add_interface(
  struct oonf_rfc5444_protocol *protocol, struct oonf_rfc5444_interface_listener *listener, const char *name) {
  struct oonf_rfc5444_interface *interf;
  uint16_t rnd;

  interf = oonf_rfc5444_get_interface(protocol, name);
  if (interf == NULL) {
    if (os_core_get_random(&rnd, sizeof(rnd))) {
      OONF_WARN(LOG_RFC5444, "Could not get random data");
      return NULL;
    }

    interf = oonf_class_malloc(&_interface_memcookie);
    if (interf == NULL) {
      return NULL;
    }

    /* set name */
    strscpy(interf->name, name, sizeof(interf->name));

    /* set protocol reference */
    interf->protocol = protocol;

    /* hook into protocol */
    interf->_node.key = interf->name;
    avl_insert(&protocol->_interface_tree, &interf->_node);

    /* initialize target subtree */
    avl_init(&interf->_target_tree, avl_comp_netaddr, false);

    /* initialize socket config */
    memcpy(&interf->_socket.config, &_socket_config, sizeof(_socket_config));
    interf->_socket.config.user = interf;
    interf->_socket.cb_settings_change = _cb_interface_changed;

    /* prevent routing of RFC5444 packets */
    interf->_socket.config.dont_route = true;

    /* initialize socket */
    oonf_packet_add_managed(&interf->_socket);

    /* initialize message sequence number */
    protocol->_msg_seqno = rnd;

    /* initialize listener list */
    list_init_head(&interf->_listener);

    /* increase protocol refcount */
    protocol->_refcount++;
  }

  OONF_INFO(LOG_RFC5444, "Add interface %s to protocol %s (refcount was %d)", name, protocol->name, interf->_refcount);

  /* increase reference count */
  interf->_refcount += 1;

  if (listener) {
    /* hookup listener */
    list_add_tail(&interf->_listener, &listener->_node);
    listener->interface = interf;
  }
  return interf;
}